

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939spy.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  char *pcVar2;
  ssize_t sVar3;
  int *piVar4;
  tm *__src;
  long in_RSI;
  undefined4 in_EDI;
  uint end;
  tm tm;
  uint64_t recvflags;
  uint64_t dst_name;
  uint8_t dst_addr;
  uint8_t priority;
  int filter;
  j1939_filter filt;
  sockaddr_can src;
  timeval ttmp;
  timeval tdut;
  timeval tref;
  uint len;
  uint j;
  int opt;
  int sock;
  int ret;
  sockaddr_can *in_stack_fffffffffffffef0;
  cmsghdr *local_100;
  uint local_ec;
  undefined4 local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  char **in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  ulong local_a8;
  undefined8 local_a0;
  byte local_96;
  byte local_95;
  int local_94;
  anon_struct_8_2_e6c1b667_for_tp local_90;
  undefined8 local_88;
  __u32 local_80;
  undefined4 local_7c;
  __u8 local_78;
  undefined1 local_77;
  sockaddr local_70;
  undefined4 local_60;
  undefined1 local_5c;
  size_t local_58;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  size_t local_38;
  ulong local_30;
  uint local_24;
  uint local_20;
  int local_1c;
  int local_18;
  uint local_14;
  long local_10;
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_94 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_1c = getopt_long(local_8,local_10,"vPb:t::?",long_opts,0), local_1c != -1) {
    if (local_1c == 0x50) {
      s.promisc = s.promisc + 1;
    }
    else if (local_1c == 0x62) {
      uVar1 = strtoul(_optarg,(char **)0x0,0);
      s.pkt_len = (int)uVar1;
    }
    else {
      if (local_1c != 0x74) {
        fputs("j1939spy: An SAE J1939 spy utility\nUsage: j1939spy [OPTION...] [[IFACE:][NAME|SA][,PGN]]\nOptions:\n  -P, --promisc\t\tRun in promiscuous mode\n\t\t\t(= receive traffic not for this ECU)\n  -b, --block=SIZE\tUse a receive buffer of SIZE (default 1024)\n  -t, --time[=a|d|z|A]\tShow time: (a)bsolute, (d)elta, (z)ero, (A)bsolute w date\n"
              ,_stderr);
        exit(1);
      }
      if (_optarg == (char *)0x0) {
        s.time = 0x7a;
      }
      else {
        pcVar2 = strchr("adzA",(int)*_optarg);
        if (pcVar2 == (char *)0x0) {
          err(1,"unknown time option \'%c\'",(int)*_optarg);
        }
        s.time = (int)*_optarg;
      }
    }
  }
  if (*(long *)(local_10 + (long)_optind * 8) != 0) {
    _optarg = *(char **)(local_10 + (long)_optind * 8);
    local_14 = libj1939_str2addr(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                 (sockaddr_can *)
                                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if ((int)local_14 < 0) {
      err(0,"bad URI %s",_optarg);
    }
  }
  buf = (uint8_t *)malloc((long)s.pkt_len);
  if (buf == (uint8_t *)0x0) {
    err(1,"malloc %u",s.pkt_len);
  }
  local_18 = socket(0x1d,2,7);
  if (local_18 < 0) {
    err(1);
  }
  memset(&local_90,0,0x20);
  if (s.addr.can_addr.j1939.name != 0) {
    local_90 = s.addr.can_addr.tp;
    local_88 = 0xffffffffffffffff;
    local_94 = local_94 + 1;
  }
  if (s.addr.can_addr.j1939.addr != 0xff) {
    local_78 = s.addr.can_addr.j1939.addr;
    local_77 = 0xff;
    local_94 = local_94 + 1;
  }
  if (s.addr.can_addr.j1939.pgn < 0x40000) {
    local_80 = s.addr.can_addr.j1939.pgn;
    local_7c = 0xffffffff;
    local_94 = local_94 + 1;
  }
  if ((local_94 != 0) && (local_14 = setsockopt(local_18,0x6b,1,&local_90,0x20), (int)local_14 < 0))
  {
    err(1,"setsockopt filter");
  }
  if ((s.promisc != 0) && (local_14 = setsockopt(local_18,0x6b,2,&ival_1,4), (int)local_14 < 0)) {
    err(1,"setsockopt promisc");
  }
  if ((s.time != 0) && (local_14 = setsockopt(local_18,1,0x1d,&ival_1,4), (int)local_14 < 0)) {
    err(1,"setsockopt timestamp");
  }
  local_14 = setsockopt(local_18,1,8,&s.pkt_len,4);
  if ((int)local_14 < 0) {
    err(1,"setsockopt rcvbuf %u",s.pkt_len);
  }
  memset(&local_70,0,0x18);
  local_70.sa_data[2] = (undefined1)s.addr.can_ifindex;
  local_70.sa_data[3] = s.addr.can_ifindex._1_1_;
  local_70.sa_data[4] = s.addr.can_ifindex._2_1_;
  local_70.sa_data[5] = s.addr.can_ifindex._3_1_;
  local_70.sa_family = 0x1d;
  local_70.sa_data[6] = '\0';
  local_70.sa_data[7] = '\0';
  local_70.sa_data[8] = '\0';
  local_70.sa_data[9] = '\0';
  local_70.sa_data[10] = '\0';
  local_70.sa_data[0xb] = '\0';
  local_70.sa_data[0xc] = '\0';
  local_70.sa_data[0xd] = '\0';
  local_5c = 0xff;
  local_60 = 0x40000;
  local_14 = bind(local_18,&local_70,0x18);
  if ((int)local_14 < 0) {
    err(1,"bind(%s)",*(undefined8 *)(local_10 + 8));
  }
  iov.iov_base = buf;
  msg.msg_name = &local_70;
  msg.msg_iov = &iov;
  msg.msg_iovlen = 1;
  msg.msg_control = ctrlmsg;
  memset(&local_38,0,0x10);
LAB_00102893:
  iov.iov_len = (size_t)s.pkt_len;
  msg.msg_namelen = 0x18;
  msg.msg_controllen = 0x68;
  msg.msg_flags = 0;
  sVar3 = recvmsg(local_18,(msghdr *)&msg,0);
  local_14 = (uint)sVar3;
  if ((int)local_14 < 0) goto code_r0x001028e6;
  goto LAB_00102937;
code_r0x001028e6:
  piVar4 = __errno_location();
  if (*piVar4 == 4) goto LAB_00102893;
  if (*piVar4 == 100) {
    err(0,"ifindex %i",s.addr.can_ifindex);
    goto LAB_00102893;
  }
  err(1,"recvmsg(ifindex %i)",s.addr.can_ifindex);
LAB_00102937:
  local_24 = local_14;
  local_a8 = 0;
  local_96 = 0;
  local_95 = 0;
  if (msg.msg_controllen < 0x10) {
    local_100 = (cmsghdr *)0x0;
  }
  else {
    local_100 = (cmsghdr *)msg.msg_control;
  }
  for (cmsg = local_100; cmsg != (cmsghdr *)0x0;
      cmsg = (cmsghdr *)__cmsg_nxthdr((msghdr *)&msg,(cmsghdr *)cmsg)) {
    if (cmsg->cmsg_level == 1) {
      if (cmsg->cmsg_type == 0x1d) {
        local_48 = cmsg[1].cmsg_len;
        local_40._0_4_ = cmsg[1].cmsg_level;
        local_40._4_4_ = cmsg[1].cmsg_type;
        local_a8 = 1L << ((byte)cmsg->cmsg_type & 0x3f) | local_a8;
      }
    }
    else if (cmsg->cmsg_level == 0x6b) {
      local_a8 = 1L << ((byte)cmsg->cmsg_type & 0x3f) | local_a8;
      if (cmsg->cmsg_type == 1) {
        local_96 = (byte)cmsg[1].cmsg_len;
      }
      else if (cmsg->cmsg_type == 2) {
        memcpy(&local_a0,cmsg + 1,cmsg->cmsg_len - 0x10);
      }
      else if (cmsg->cmsg_type == 3) {
        local_95 = (byte)cmsg[1].cmsg_len;
      }
    }
  }
  if ((local_a8 & 0x20000000) != 0) {
    if (s.time == 0x7a) {
      if (local_38 == 0) {
        local_38 = local_48;
        local_30 = local_40;
      }
      local_58 = local_48 - local_38;
      local_50 = local_40 - local_30;
      if ((long)local_50 < 0) {
        local_58 = local_58 - 1;
        local_50 = local_50 + 1000000;
      }
      local_48 = local_58;
      local_40 = local_50;
    }
    else if (s.time == 100) {
      local_58 = local_48 - local_38;
      local_50 = local_40 - local_30;
      if ((long)local_50 < 0) {
        local_58 = local_58 - 1;
        local_50 = local_50 + 1000000;
      }
      local_38 = local_48;
      local_30 = local_40;
      local_48 = local_58;
      local_40 = local_50;
    }
    else if (s.time != 0x61) {
      if (s.time == 0x41) {
        __src = localtime((time_t *)&local_48);
        memcpy(&local_e8,__src,0x38);
        in_stack_fffffffffffffef0 = (sockaddr_can *)(local_40 / 100);
        printf("(%04u%02u%02uT%02u%02u%02u.%04llu)",(ulong)(in_stack_ffffffffffffff2c + 0x76c),
               (ulong)(in_stack_ffffffffffffff28 + 1),(ulong)local_dc,(ulong)local_e0,
               (ulong)local_e4,local_e8);
      }
      goto LAB_00102d23;
    }
    printf("(%llu.%04llu)",local_48,local_40 / 100);
  }
LAB_00102d23:
  pcVar2 = libj1939_addr2str(in_stack_fffffffffffffef0);
  printf(" %s ",pcVar2);
  if ((local_a8 & 4) == 0) {
    if ((local_a8 & 2) == 0) {
      printf("- ");
    }
    else {
      printf("%02x ",(ulong)local_96);
    }
  }
  else {
    printf("%016llx ",local_a0);
  }
  printf("!%u ",(ulong)local_95);
  pcVar2 = "";
  if ((msg.msg_flags & 0x20U) != 0) {
    pcVar2 = "...";
  }
  printf("[%i%s]",(ulong)local_24,pcVar2);
  local_20 = 0;
  while (local_20 < local_24) {
    local_ec = local_20 + 4;
    if (local_24 < local_ec) {
      local_ec = local_24;
    }
    printf(" ");
    for (; local_20 < local_ec; local_20 = local_20 + 1) {
      printf("%02x",(ulong)buf[local_20]);
    }
  }
  printf("\n");
  goto LAB_00102893;
}

Assistant:

int main(int argc, char **argv)
{
	int ret, sock, opt;
	unsigned int j, len;
	struct timeval tref, tdut, ttmp;
	struct sockaddr_can src;
	struct j1939_filter filt;
	int filter = 0;
	uint8_t priority, dst_addr;
	uint64_t dst_name;
	uint64_t recvflags;

	/* argument parsing */
	while ((opt = getopt_long(argc, argv, optstring, long_opts, NULL)) != -1)
		switch (opt) {
		case 'b':
			s.pkt_len = strtoul(optarg, 0, 0);
			break;
		case 'P':
			++s.promisc;
			break;
		case 't':
			if (optarg) {
				if (!strchr("adzA", optarg[0]))
					err(1, "unknown time option '%c'",
					    optarg[0]);
				s.time = optarg[0];
			} else {
				s.time = 'z';
			}
			break;
		default:
			fputs(help_msg, stderr);
			exit(1);
			break;
		}

	if (argv[optind]) {
		optarg = argv[optind];
		ret = libj1939_str2addr(optarg, 0, &s.addr);
		if (ret < 0) {
			err(0, "bad URI %s", optarg);
			return 1;
		}
	}

	buf = malloc(s.pkt_len);
	if (!buf)
		err(1, "malloc %u", s.pkt_len);

	/* setup socket */
	sock = socket(PF_CAN, SOCK_DGRAM, CAN_J1939);
	if (sock < 0)
		err(1, "socket(can, dgram, j1939)");

	memset(&filt, 0, sizeof(filt));
	if (s.addr.can_addr.j1939.name) {
		filt.name = s.addr.can_addr.j1939.name;
		filt.name_mask = ~0ULL;
		++filter;
	}
	if (s.addr.can_addr.j1939.addr < 0xff) {
		filt.addr = s.addr.can_addr.j1939.addr;
		filt.addr_mask = ~0;
		++filter;
	}
	if (s.addr.can_addr.j1939.pgn <= J1939_PGN_MAX) {
		filt.pgn = s.addr.can_addr.j1939.pgn;
		filt.pgn_mask = ~0;
		++filter;
	}
	if (filter) {
		ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_FILTER, &filt, sizeof(filt));
		if (ret < 0)
			err(1, "setsockopt filter");
	}

	if (s.promisc) {
		ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_PROMISC, &ival_1, sizeof(ival_1));
		if (ret < 0)
			err(1, "setsockopt promisc");
	}

	if (s.time) {
		ret = setsockopt(sock, SOL_SOCKET, SO_TIMESTAMP, &ival_1, sizeof(ival_1));
		if (ret < 0)
			err(1, "setsockopt timestamp");
	}
	ret = setsockopt(sock, SOL_SOCKET, SO_RCVBUF, &s.pkt_len, sizeof(s.pkt_len));
	if (ret < 0)
		err(1, "setsockopt rcvbuf %u", s.pkt_len);

	/* bind(): to default, only ifindex is used. */
	memset(&src, 0, sizeof(src));
	src.can_ifindex = s.addr.can_ifindex;
	src.can_family = AF_CAN;
	src.can_addr.j1939.name = J1939_NO_NAME;
	src.can_addr.j1939.addr = J1939_NO_ADDR;
	src.can_addr.j1939.pgn = J1939_NO_PGN;
	ret = bind(sock, (void *)&src, sizeof(src));
	if (ret < 0)
		err(1, "bind(%s)", argv[1]);

	/* these settings are static and can be held out of the hot path */
	iov.iov_base = &buf[0];
	msg.msg_name = &src;
	msg.msg_iov = &iov;
	msg.msg_iovlen = 1;
	msg.msg_control = &ctrlmsg;

	memset(&tref, 0, sizeof(tref));
	while (1) {
		/* these settings may be modified by recvmsg() */
		iov.iov_len = s.pkt_len;
		msg.msg_namelen = sizeof(src);
		msg.msg_controllen = sizeof(ctrlmsg);
		msg.msg_flags = 0;

		ret = recvmsg(sock, &msg, 0);
		//ret = recvfrom(buf, s.pkt_len, 0, (void *)&addr, &len);
		if (ret < 0) {
			switch (errno) {
			case ENETDOWN:
				err(0, "ifindex %i", s.addr.can_ifindex);
				continue;
			case EINTR:
				continue;
			default:
				err(1, "recvmsg(ifindex %i)", s.addr.can_ifindex);
				break;
			}
		}
		len = ret;
		recvflags = 0;
		dst_addr = 0;
		priority = 0;
		for (cmsg = CMSG_FIRSTHDR(&msg); cmsg; cmsg = CMSG_NXTHDR(&msg, cmsg)) {
			switch (cmsg->cmsg_level) {
			case SOL_SOCKET:
				if (cmsg->cmsg_type == SCM_TIMESTAMP) {
					memcpy(&tdut, CMSG_DATA(cmsg), sizeof(tdut));
					recvflags |= 1ULL << cmsg->cmsg_type;
				}
				break;
			case SOL_CAN_J1939:
				recvflags |= 1ULL << cmsg->cmsg_type;
				if (cmsg->cmsg_type == SCM_J1939_DEST_ADDR)
					dst_addr = *CMSG_DATA(cmsg);
				else if (cmsg->cmsg_type == SCM_J1939_DEST_NAME)
					memcpy(&dst_name, CMSG_DATA(cmsg), cmsg->cmsg_len - CMSG_LEN(0));
				else if (cmsg->cmsg_type == SCM_J1939_PRIO)
					priority = *CMSG_DATA(cmsg);
				break;
			}

		}
		if (recvflags & (1ULL << SCM_TIMESTAMP)) {
			if ('z' == s.time) {
				if (!tref.tv_sec)
					tref = tdut;
				timersub(&tdut, &tref, &ttmp);
				tdut = ttmp;
				goto abs_time;
			} else if ('d' == s.time) {
				timersub(&tdut, &tref, &ttmp);
				tref = tdut;
				tdut = ttmp;
				goto abs_time;
			} else if ('a' == s.time) {
abs_time:
				printf("(%llu.%04llu)", (unsigned long long)tdut.tv_sec, (unsigned long long)tdut.tv_usec / 100);
			} else if ('A' == s.time) {
				struct tm tm;
				tm = *localtime(&tdut.tv_sec);
				printf("(%04u%02u%02uT%02u%02u%02u.%04llu)",
					tm.tm_year + 1900, tm.tm_mon + 1, tm.tm_mday,
					tm.tm_hour, tm.tm_min, tm.tm_sec,
					(unsigned long long)tdut.tv_usec/100);
			}
		}
		printf(" %s ", libj1939_addr2str(&src));
		if (recvflags & (1ULL << SCM_J1939_DEST_NAME))
			printf("%016llx ", (unsigned long long)dst_name);
		else if (recvflags & (1ULL << SCM_J1939_DEST_ADDR))
			printf("%02x ", dst_addr);
		else
			printf("- ");
		printf("!%u ", priority);

		printf("[%i%s]", len, (msg.msg_flags & MSG_TRUNC) ? "..." : "");
		for (j = 0; j < len;) {
			unsigned int end = j + 4;
			if (end > len)
				end = len;
			printf(" ");
			for (; j < end; ++j)
				printf("%02x", buf[j]);
		}
		printf("\n");
	}

	free(buf);
	return 0;
}